

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong *puVar21;
  HUF_CElt endMark;
  HUF_CElt local_38;
  
  if ((dstSize < 8) || (dstSize == 8)) {
    sVar3 = 0;
  }
  else {
    uVar4 = (uint)*CTable;
    puVar21 = (ulong *)((long)dst + (dstSize - 8));
    uVar5 = (uint)srcSize;
    puVar6 = (ulong *)dst;
    if (uVar4 < 0xc && ((*CTable & 0xffffffff) * srcSize >> 3) + 8 <= dstSize) {
      switch(uVar4) {
      case 7:
        uVar4 = uVar5 + 7;
        if (-1 < (int)uVar5) {
          uVar4 = uVar5;
        }
        iVar7 = uVar5 - (uVar4 & 0xfffffff8);
        if (iVar7 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = iVar7 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) {
LAB_0021bd8a:
            __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x392,"void HUF_flushBits(HUF_CStream_t *, int)");
          }
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        if ((srcSize & 7) != 0) {
LAB_0021bd0e:
          __assert_fail("n % kUnroll == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x3cc,
                        "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                       );
        }
        if ((srcSize & 8) != 0) {
          lVar2 = (long)(int)srcSize;
          lVar9 = 7;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -8) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12 & 0xffffffffffffff00;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) {
LAB_0021bc92:
            __assert_fail("bitC->ptr <= bitC->endPtr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x393,"void HUF_flushBits(HUF_CStream_t *, int)");
          }
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) {
LAB_0021bcb1:
            __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x396,"void HUF_flushBits(HUF_CStream_t *, int)");
          }
          srcSize = lVar2 - 8;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        if ((srcSize & 0xf) != 0) goto LAB_0021bd2d;
        if (0 < (int)srcSize) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 9);
          do {
            lVar10 = 7;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -7 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 8) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19 & 0xffffffffffffff00;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 7;
            lVar10 = 0;
            uVar19 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -7 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar19 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 0x10)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14 & 0xffffffffffffff00 |
                     uVar18 >> ((byte)uVar15 & 0x3f);
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 0x10;
            lVar2 = lVar2 + -0x10;
            lVar9 = lVar9 + -0x10;
            bVar1 = 0x10 < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
        break;
      case 8:
        if ((int)uVar5 % 7 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = (int)uVar5 % 7 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) goto LAB_0021bd8a;
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * -0x49249249 + 0x12492492;
        if (0x24924924 < uVar5) goto LAB_0021bd0e;
        if (0x12492492 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar9 = 6;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -7) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12 & 0xffffffffffffff00;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          srcSize = lVar2 - 7;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * -0x49249249 + 0x12492492;
        if (0x12492492 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) goto LAB_0021bd2d;
        if (0 < (int)srcSize) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 8);
          do {
            lVar10 = 6;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -6 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 7) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19 & 0xffffffffffffff00;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 6;
            lVar10 = 0;
            uVar19 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -6 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar19 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 0xe)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14 & 0xffffffffffffff00 |
                     uVar18 >> ((byte)uVar15 & 0x3f);
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 0xe;
            lVar2 = lVar2 + -0xe;
            lVar9 = lVar9 + -0xe;
            bVar1 = 0xe < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
        break;
      case 9:
        if ((int)uVar5 % 6 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = (int)uVar5 % 6 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) goto LAB_0021bd8a;
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        iVar7 = (int)srcSize;
        uVar5 = iVar7 * -0x55555555 + 0x2aaaaaaa;
        if (0x2aaaaaaa < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) goto LAB_0021bd0e;
        if (0x15555554 < (iVar7 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar7 * -0x40000000)) {
          lVar2 = (long)iVar7;
          lVar9 = 5;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -6) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12 & 0xffffffffffffff00;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          srcSize = lVar2 - 6;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        iVar7 = (int)srcSize;
        if (0x15555554 < (iVar7 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar7 * -0x40000000))
        goto LAB_0021bd2d;
        if (0 < iVar7) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 7);
          do {
            lVar10 = 5;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -5 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 6) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19 & 0xffffffffffffff00;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 5;
            lVar10 = 0;
            uVar19 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -5 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar19 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 0xc)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14 & 0xffffffffffffff00 |
                     uVar18 >> ((byte)uVar15 & 0x3f);
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 0xc;
            lVar2 = lVar2 + -0xc;
            lVar9 = lVar9 + -0xc;
            bVar1 = 0xc < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
        break;
      case 10:
        if ((int)uVar5 % 5 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = (int)uVar5 % 5 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) goto LAB_0021bd8a;
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        iVar7 = (int)srcSize * -0x33333333;
        if (0x33333332 < iVar7 + 0x19999999U) goto LAB_0021bd0e;
        uVar5 = iVar7 + 0x19999998;
        if (0x19999998 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar9 = 4;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -5) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          srcSize = lVar2 - 5;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * -0x33333333 + 0x19999998;
        if (0x19999998 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) goto LAB_0021bd2d;
        if (0 < (int)srcSize) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 6);
          do {
            lVar10 = 4;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 5) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar19 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar19 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 4;
            lVar10 = 0;
            uVar18 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -4 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 10)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar18 >> ((byte)uVar14 & 0x3f) | uVar19 >> ((byte)uVar15 & 0x3f) | uVar14;
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 10;
            lVar2 = lVar2 + -10;
            lVar9 = lVar9 + -10;
            bVar1 = 10 < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
        break;
      case 0xb:
        if ((int)uVar5 % 5 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = (int)uVar5 % 5 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) goto LAB_0021bd8a;
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        iVar7 = (int)srcSize * -0x33333333;
        if (0x33333332 < iVar7 + 0x19999999U) goto LAB_0021bd0e;
        uVar5 = iVar7 + 0x19999998;
        if (0x19999998 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar9 = 4;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -5) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12 & 0xffffffffffffff00;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          srcSize = lVar2 - 5;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * -0x33333333 + 0x19999998;
        if (0x19999998 < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) goto LAB_0021bd2d;
        if (0 < (int)srcSize) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 6);
          do {
            lVar10 = 4;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 5) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19 & 0xffffffffffffff00;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 4;
            lVar10 = 0;
            uVar19 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -4 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar19 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 10)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14 & 0xffffffffffffff00 |
                     uVar18 >> ((byte)uVar15 & 0x3f);
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 10;
            lVar2 = lVar2 + -10;
            lVar9 = lVar9 + -10;
            bVar1 = 10 < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
        break;
      default:
        if ((int)uVar5 % 9 < 1) {
          uVar18 = 0;
          uVar13 = 0;
        }
        else {
          pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
          iVar7 = (int)uVar5 % 9 + 1;
          uVar13 = 0;
          uVar18 = 0;
          do {
            pbVar8 = pbVar8 + -1;
            uVar12 = CTable[(ulong)*pbVar8 + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar12 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar12 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar7 = iVar7 + -1;
          } while (1 < iVar7);
          uVar12 = uVar13 & 0xff;
          if (uVar12 == 0) goto LAB_0021bc73;
          if (0x40 < (uint)uVar12) goto LAB_0021bd8a;
          if (puVar21 < dst) goto LAB_0021bc92;
          *(ulong *)dst = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar12 >> 3) + (long)dst);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
        if (0x1c71c71c < uVar5) goto LAB_0021bd0e;
        if (0xe38e38e < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar9 = 8;
          do {
            uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -9) + 1];
            if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar12;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          uVar19 = uVar13 & 0xff;
          if (0x40 < uVar19) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
          if (uVar19 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
          if (puVar21 < puVar6) goto LAB_0021bcb1;
          srcSize = lVar2 - 9;
          uVar13 = (ulong)((uint)uVar13 & 7);
        }
        uVar5 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
        if (0xe38e38e < (uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f)) goto LAB_0021bd2d;
        if (0 < (int)srcSize) {
          uVar12 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar12 - 1);
          lVar9 = (long)src + (uVar12 - 10);
          do {
            lVar10 = 8;
            do {
              uVar19 = CTable[(ulong)*(byte *)(lVar2 + -8 + lVar10) + 1];
              if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
              uVar13 = uVar13 + uVar19;
              if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            uVar19 = CTable[(ulong)*(byte *)((uVar12 - 9) + (long)src) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            uVar14 = uVar13 & 0xff;
            if (0x40 < uVar14) goto LAB_0021bc35;
            uVar19 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
            if (uVar14 == 0) goto LAB_0021bc73;
            if (puVar21 < puVar6) goto LAB_0021bc92;
            *puVar6 = uVar19 >> (-(char)uVar13 & 0x3fU);
            puVar6 = (ulong *)((uVar14 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            lVar20 = 8;
            lVar10 = 0;
            uVar18 = 0;
            do {
              uVar14 = CTable[(ulong)*(byte *)(lVar9 + -8 + lVar20) + 1];
              if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
              lVar10 = lVar10 + uVar14;
              if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
              uVar18 = uVar18 >> ((byte)uVar14 & 0x3f) | uVar14;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
            uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 0x12)) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            uVar15 = lVar10 + uVar14;
            if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
            if ((int)(uVar15 & 0xff) == 0x40) goto LAB_0021bcef;
            uVar17 = uVar15 + ((uint)uVar13 & 7);
            uVar13 = uVar17 & 0xff;
            if (0x40 < uVar13) goto LAB_0021bcd0;
            if (uVar13 == 0) goto LAB_0021bc73;
            uVar18 = uVar18 >> ((byte)uVar14 & 0x3f) | uVar19 >> ((byte)uVar15 & 0x3f) | uVar14;
            *puVar6 = uVar18 >> (-(char)uVar17 & 0x3fU);
            puVar6 = (ulong *)((uVar13 >> 3) + (long)puVar6);
            if (puVar21 < puVar6) goto LAB_0021bcb1;
            uVar13 = (ulong)((uint)uVar17 & 7);
            srcSize = uVar12 - 0x12;
            lVar2 = lVar2 + -0x12;
            lVar9 = lVar9 + -0x12;
            bVar1 = 0x12 < (long)uVar12;
            uVar12 = srcSize;
          } while (bVar1);
        }
      }
    }
    else {
      uVar4 = uVar5 + 3;
      if (-1 < (int)uVar5) {
        uVar4 = uVar5;
      }
      iVar7 = uVar5 - (uVar4 & 0xfffffffc);
      if (iVar7 < 1) {
        uVar18 = 0;
        uVar13 = 0;
      }
      else {
        pbVar8 = (byte *)((long)(int)uVar5 + (long)src);
        iVar7 = iVar7 + 1;
        uVar12 = 0;
        uVar18 = 0;
        do {
          pbVar8 = pbVar8 + -1;
          uVar13 = CTable[(ulong)*pbVar8 + 1];
          if (0xc < (uVar13 & 0xff)) goto LAB_0021bc54;
          uVar12 = uVar12 + uVar13;
          if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_0021bc35;
          uVar18 = uVar13 & 0xffffffffffffff00 | uVar18 >> ((byte)uVar13 & 0x3f);
          srcSize = (size_t)((int)srcSize - 1);
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
        uVar19 = uVar12 & 0xff;
        if (uVar19 == 0) goto LAB_0021bc73;
        if (0x40 < (uint)uVar19) goto LAB_0021bd8a;
        if (puVar21 < dst) goto LAB_0021bc92;
        uVar13 = (ulong)((uint)uVar12 & 7);
        *(ulong *)dst = uVar18 >> (-(char)uVar12 & 0x3fU);
        puVar6 = (ulong *)((uVar19 >> 3) + (long)dst);
        if (puVar21 < puVar6) {
          puVar6 = puVar21;
        }
      }
      if ((srcSize & 3) != 0) goto LAB_0021bd0e;
      if ((srcSize & 4) != 0) {
        lVar2 = (long)(int)srcSize;
        lVar9 = 3;
        do {
          uVar12 = CTable[(ulong)*(byte *)((long)src + lVar9 + lVar2 + -4) + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar12;
          if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        uVar12 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
        if (0xc < (uVar12 & 0xff)) goto LAB_0021bc54;
        uVar14 = uVar13 + uVar12;
        uVar19 = uVar14 & 0xff;
        if (0x40 < uVar19) goto LAB_0021bc35;
        uVar18 = uVar18 >> ((byte)uVar12 & 0x3f) | uVar12 & 0xffffffffffffff00;
        if (uVar19 == 0) goto LAB_0021bc73;
        if (puVar21 < puVar6) goto LAB_0021bc92;
        srcSize = lVar2 - 4;
        uVar13 = (ulong)((uint)uVar14 & 7);
        *puVar6 = uVar18 >> (-(char)uVar14 & 0x3fU);
        puVar6 = (ulong *)((uVar19 >> 3) + (long)puVar6);
        if (puVar21 < puVar6) {
          puVar6 = puVar21;
        }
      }
      if ((srcSize & 7) != 0) {
LAB_0021bd2d:
        __assert_fail("n % (2 * kUnroll) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x3d8,
                      "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                     );
      }
      if (0 < (int)srcSize) {
        uVar12 = srcSize & 0xffffffff;
        lVar2 = (long)src + (uVar12 - 1);
        lVar9 = (long)src + (uVar12 - 5);
        do {
          lVar10 = 3;
          do {
            uVar19 = CTable[(ulong)*(byte *)(lVar2 + -3 + lVar10) + 1];
            if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
            uVar13 = uVar13 + uVar19;
            if (0x40 < ((uint)uVar13 & 0xff)) goto LAB_0021bc35;
            uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
          uVar19 = CTable[(ulong)*(byte *)((uVar12 - 4) + (long)src) + 1];
          if (0xc < (uVar19 & 0xff)) goto LAB_0021bc54;
          uVar13 = uVar13 + uVar19;
          uVar14 = uVar13 & 0xff;
          if (0x40 < uVar14) goto LAB_0021bc35;
          uVar18 = uVar18 >> ((byte)uVar19 & 0x3f) | uVar19 & 0xffffffffffffff00;
          if (uVar14 == 0) goto LAB_0021bc73;
          if (puVar21 < puVar6) goto LAB_0021bc92;
          puVar11 = (ulong *)((uVar14 >> 3) + (long)puVar6);
          if (puVar21 < puVar11) {
            puVar11 = puVar21;
          }
          *puVar6 = uVar18 >> (-(char)uVar13 & 0x3fU);
          lVar20 = 3;
          lVar10 = 0;
          uVar19 = 0;
          do {
            uVar14 = CTable[(ulong)*(byte *)(lVar9 + -3 + lVar20) + 1];
            if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
            lVar10 = lVar10 + uVar14;
            if (0x40 < ((uint)lVar10 & 0xff)) goto LAB_0021bc35;
            uVar19 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
          uVar14 = CTable[(ulong)*(byte *)((long)src + (uVar12 - 8)) + 1];
          if (0xc < (uVar14 & 0xff)) goto LAB_0021bc54;
          uVar15 = lVar10 + uVar14;
          if (0x40 < (uVar15 & 0xff)) goto LAB_0021bc35;
          if ((int)(uVar15 & 0xff) == 0x40) {
LAB_0021bcef:
            __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x37a,"void HUF_mergeIndex1(HUF_CStream_t *)");
          }
          uVar16 = uVar15 + ((uint)uVar13 & 7);
          uVar17 = uVar16 & 0xff;
          if (0x40 < uVar17) {
LAB_0021bcd0:
            __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x37e,"void HUF_mergeIndex1(HUF_CStream_t *)");
          }
          if (uVar17 == 0) goto LAB_0021bc73;
          uVar18 = uVar19 >> ((byte)uVar14 & 0x3f) | uVar14 & 0xffffffffffffff00 |
                   uVar18 >> ((byte)uVar15 & 0x3f);
          uVar13 = (ulong)((uint)uVar16 & 7);
          *puVar11 = uVar18 >> (-(char)uVar16 & 0x3fU);
          puVar6 = (ulong *)((uVar17 >> 3) + (long)puVar11);
          if (puVar21 < puVar6) {
            puVar6 = puVar21;
          }
          srcSize = uVar12 - 8;
          lVar2 = lVar2 + -8;
          lVar9 = lVar9 + -8;
          bVar1 = 8 < (long)uVar12;
          uVar12 = srcSize;
        } while (bVar1);
      }
    }
    if ((int)srcSize != 0) {
      __assert_fail("n == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x3ef,
                    "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                   );
    }
    if (puVar21 < puVar6) {
      __assert_fail("bitC.ptr <= bitC.endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x43a,
                    "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                   );
    }
    local_38 = 1;
    HUF_setValue(&local_38,1);
    if (0xc < (local_38 & 0xff)) {
LAB_0021bc54:
      __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x34f,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
    uVar13 = uVar13 + local_38;
    uVar12 = uVar13 & 0xff;
    if (0x40 < uVar12) {
LAB_0021bc35:
      __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x35b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
    if (uVar12 == 0) {
LAB_0021bc73:
      __assert_fail("nbBits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x391,"void HUF_flushBits(HUF_CStream_t *, int)");
    }
    *puVar6 = (local_38 & 0xffffffffffffff00 | uVar18 >> ((byte)local_38 & 0x3f)) >>
              (-(char)uVar13 & 0x3fU);
    puVar6 = (ulong *)((uVar12 >> 3) + (long)puVar6);
    if (puVar21 < puVar6) {
      puVar6 = puVar21;
    }
    sVar3 = 0;
    if (puVar6 < puVar21) {
      sVar3 = (long)puVar6 - ((long)dst + ((ulong)((uVar13 & 7) == 0) - 1));
    }
  }
  return sVar3;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}